

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.hpp
# Opt level: O3

Error * __thiscall
ot::commissioner::coap::Message::SetContentFormat
          (Error *__return_storage_ptr__,Message *this,ContentFormat aContentFormat)

{
  OptionValue local_30;
  
  OptionValue::OptionValue(&local_30,aContentFormat);
  AppendOption(__return_storage_ptr__,this,kContentFormat,&local_30);
  if (local_30.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.mValue.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Error SetContentFormat(ContentFormat aContentFormat)
    {
        return AppendOption(OptionType::kContentFormat, OptionValue{utils::to_underlying(aContentFormat)});
    }